

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Generic.cc
# Opt level: O1

ssize_t avro::GenericWriter::write(int __fd,void *__buf,size_t __n)

{
  pointer pGVar1;
  pointer puVar2;
  pointer ppVar3;
  int iVar4;
  GenericUnion *pGVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  double *pdVar7;
  GenericArray *pGVar8;
  float *pfVar9;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar10;
  size_t *psVar11;
  GenericFixed *pGVar12;
  ssize_t sVar13;
  uint *puVar14;
  bool *pbVar15;
  GenericRecord *pGVar16;
  undefined4 extraout_var;
  GenericMap *pGVar17;
  GenericEnum *pGVar18;
  code *UNRECOVERED_JUMPTABLE;
  Exception *this;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar19;
  size_t __n_00;
  size_t extraout_RDX;
  size_t __n_01;
  size_t extraout_RDX_00;
  size_t __n_02;
  uint uVar20;
  size_t sVar21;
  undefined4 in_register_0000003c;
  GenericDatum *pGVar22;
  pointer pGVar23;
  long lVar24;
  pointer ppVar25;
  double dVar26;
  uint8_t b;
  put_holder<char,_std::char_traits<char>_> local_120;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  
  pGVar22 = (GenericDatum *)CONCAT44(in_register_0000003c,__fd);
  while (pGVar22->type_ == AVRO_UNION) {
    pGVar5 = boost::any_cast<avro::GenericUnion>(&pGVar22->value_);
    (**(code **)(*__buf + 0xa0))(__buf,pGVar5->curBranch_);
    pGVar5 = boost::any_cast<avro::GenericUnion>(&pGVar22->value_);
    pGVar22 = &pGVar5->datum_;
  }
  switch(pGVar22->type_) {
  case AVRO_STRING:
    pbVar6 = boost::any_cast<std::__cxx11::string>(&pGVar22->value_);
    sVar13 = (**(code **)(*__buf + 0x50))(__buf,pbVar6);
    return sVar13;
  case AVRO_BYTES:
    pvVar10 = boost::any_cast<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                        (&pGVar22->value_);
    local_108.items_.
    super__Vector_base<boost::io::detail::format_item<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<boost::io::detail::format_item<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start._0_1_ = 0;
    pbVar19 = (basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)
              (pvVar10->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)
        (pvVar10->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_finish == pbVar19) {
      pbVar19 = &local_108;
    }
    sVar13 = (**(code **)(*__buf + 0x58))(__buf,pbVar19);
    break;
  case AVRO_INT:
    puVar14 = (uint *)boost::any_cast<int>(&pGVar22->value_);
    uVar20 = *puVar14;
    UNRECOVERED_JUMPTABLE = *(code **)(*__buf + 0x30);
    goto LAB_001624e9;
  case AVRO_LONG:
    psVar11 = (size_t *)boost::any_cast<long>(&pGVar22->value_);
    sVar21 = *psVar11;
    UNRECOVERED_JUMPTABLE = *(code **)(*__buf + 0x38);
    goto LAB_001625f7;
  case AVRO_FLOAT:
    pfVar9 = boost::any_cast<float>(&pGVar22->value_);
    dVar26 = (double)(ulong)(uint)*pfVar9;
    UNRECOVERED_JUMPTABLE = *(code **)(*__buf + 0x40);
    goto LAB_00162413;
  case AVRO_DOUBLE:
    pdVar7 = boost::any_cast<double>(&pGVar22->value_);
    dVar26 = *pdVar7;
    UNRECOVERED_JUMPTABLE = *(code **)(*__buf + 0x48);
LAB_00162413:
    sVar13 = (*UNRECOVERED_JUMPTABLE)(dVar26,__buf);
    return sVar13;
  case AVRO_BOOL:
    pbVar15 = boost::any_cast<bool>(&pGVar22->value_);
    uVar20 = (uint)*pbVar15;
    UNRECOVERED_JUMPTABLE = *(code **)(*__buf + 0x28);
LAB_001624e9:
    sVar13 = (*UNRECOVERED_JUMPTABLE)(__buf,uVar20);
    return sVar13;
  case AVRO_NULL:
    sVar13 = (**(code **)(*__buf + 0x20))(__buf);
    return sVar13;
  case AVRO_RECORD:
    pGVar16 = boost::any_cast<avro::GenericRecord>(&pGVar22->value_);
    iVar4 = (*((pGVar16->super_GenericContainer).schema_.px)->_vptr_Node[4])();
    sVar13 = CONCAT44(extraout_var,iVar4);
    if (sVar13 != 0) {
      iVar4 = 0;
      __n_01 = extraout_RDX;
      lVar24 = sVar13;
      do {
        sVar13 = write((int)(pGVar16->fields_).
                            super__Vector_base<avro::GenericDatum,_std::allocator<avro::GenericDatum>_>
                            ._M_impl.super__Vector_impl_data._M_start + iVar4,__buf,__n_01);
        iVar4 = iVar4 + 0x10;
        lVar24 = lVar24 + -1;
        __n_01 = extraout_RDX_00;
      } while (lVar24 != 0);
    }
    break;
  case AVRO_ENUM:
    pGVar18 = boost::any_cast<avro::GenericEnum>(&pGVar22->value_);
    sVar21 = pGVar18->value_;
    UNRECOVERED_JUMPTABLE = *(code **)(*__buf + 0x68);
LAB_001625f7:
    sVar13 = (*UNRECOVERED_JUMPTABLE)(__buf,sVar21);
    return sVar13;
  case AVRO_ARRAY:
    pGVar8 = boost::any_cast<avro::GenericArray>(&pGVar22->value_);
    (**(code **)(*__buf + 0x70))(__buf);
    pGVar23 = (pGVar8->value_).
              super__Vector_base<avro::GenericDatum,_std::allocator<avro::GenericDatum>_>._M_impl.
              super__Vector_impl_data._M_start;
    pGVar1 = (pGVar8->value_).
             super__Vector_base<avro::GenericDatum,_std::allocator<avro::GenericDatum>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pGVar23 != pGVar1) {
      (**(code **)(*__buf + 0x90))(__buf,(long)pGVar1 - (long)pGVar23 >> 4);
      for (pGVar23 = (pGVar8->value_).
                     super__Vector_base<avro::GenericDatum,_std::allocator<avro::GenericDatum>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          pGVar23 !=
          (pGVar8->value_).
          super__Vector_base<avro::GenericDatum,_std::allocator<avro::GenericDatum>_>._M_impl.
          super__Vector_impl_data._M_finish; pGVar23 = pGVar23 + 1) {
        (**(code **)(*__buf + 0x98))(__buf);
        write((int)pGVar23,__buf,__n_00);
      }
    }
    sVar13 = (**(code **)(*__buf + 0x78))(__buf);
    return sVar13;
  case AVRO_MAP:
    pGVar17 = boost::any_cast<avro::GenericMap>(&pGVar22->value_);
    (**(code **)(*__buf + 0x80))(__buf);
    ppVar25 = (pGVar17->value_).
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::GenericDatum>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::GenericDatum>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppVar3 = (pGVar17->value_).
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::GenericDatum>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::GenericDatum>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (ppVar25 != ppVar3) {
      (**(code **)(*__buf + 0x90))(__buf,((long)ppVar3 - (long)ppVar25 >> 4) * -0x5555555555555555);
      for (ppVar25 = (pGVar17->value_).
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::GenericDatum>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::GenericDatum>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          ppVar25 !=
          (pGVar17->value_).
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::GenericDatum>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::GenericDatum>_>_>
          ._M_impl.super__Vector_impl_data._M_finish; ppVar25 = ppVar25 + 1) {
        (**(code **)(*__buf + 0x98))(__buf);
        (**(code **)(*__buf + 0x50))(__buf,ppVar25);
        write((int)ppVar25 + 0x20,__buf,__n_02);
      }
    }
    sVar13 = (**(code **)(*__buf + 0x88))(__buf);
    return sVar13;
  default:
    this = (Exception *)__cxa_allocate_exception(0x18);
    boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
              (&local_108,"Unknown schema type %1%");
    local_120.arg = toString_abi_cxx11_(pGVar22->type_);
    local_120.put_head =
         boost::io::detail::call_put_head<char,std::char_traits<char>,std::__cxx11::string_const>;
    local_120.put_last =
         boost::io::detail::call_put_last<char,std::char_traits<char>,std::__cxx11::string_const>;
    pbVar19 = boost::io::detail::
              feed_impl<char,std::char_traits<char>,std::allocator<char>,boost::io::detail::put_holder<char,std::char_traits<char>>const&>
                        (&local_108,&local_120);
    Exception::Exception(this,pbVar19);
    __cxa_throw(this,&Exception::typeinfo,Exception::~Exception);
  case AVRO_FIXED:
    pGVar12 = boost::any_cast<avro::GenericFixed>(&pGVar22->value_);
    puVar2 = (pGVar12->value_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    sVar13 = (**(code **)(*__buf + 0x60))
                       (__buf,puVar2,
                        (long)(pGVar12->value_).
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)puVar2);
    return sVar13;
  }
  return sVar13;
}

Assistant:

void GenericWriter::write(const GenericDatum& datum, Encoder& e)
{
    if (datum.isUnion()) {
        e.encodeUnionIndex(datum.unionBranch());
        write(datum.value<GenericUnion>().datum(), e);
        return;
    }
    switch (datum.type()) {
    case AVRO_NULL:
        e.encodeNull();
        break;
    case AVRO_BOOL:
        e.encodeBool(datum.value<bool>());
        break;
    case AVRO_INT:
        e.encodeInt(datum.value<int32_t>());
        break;
    case AVRO_LONG:
        e.encodeLong(datum.value<int64_t>());
        break;
    case AVRO_FLOAT:
        e.encodeFloat(datum.value<float>());
        break;
    case AVRO_DOUBLE:
        e.encodeDouble(datum.value<double>());
        break;
    case AVRO_STRING:
        e.encodeString(datum.value<string>());
        break;
    case AVRO_BYTES:
        e.encodeBytes(datum.value<bytes>());
        break;
    case AVRO_FIXED:
        e.encodeFixed(datum.value<GenericFixed>().value());
        break;
    case AVRO_RECORD:
        {
            const GenericRecord& r = datum.value<GenericRecord>();
            size_t c = r.schema()->leaves();
            for (size_t i = 0; i < c; ++i) {
                write(r.fieldAt(i), e);
            }
        }
        break;
    case AVRO_ENUM:
        e.encodeEnum(datum.value<GenericEnum>().value());
        break;
    case AVRO_ARRAY:
        {
            const GenericArray::Value& r = datum.value<GenericArray>().value();
            e.arrayStart();
            if (! r.empty()) {
                e.setItemCount(r.size());
                for (GenericArray::Value::const_iterator it = r.begin();
                    it != r.end(); ++it) {
                    e.startItem();
                    write(*it, e);
                }
            }
            e.arrayEnd();
        }
        break;
    case AVRO_MAP:
        {
            const GenericMap::Value& r = datum.value<GenericMap>().value();
            e.mapStart();
            if (! r.empty()) {
                e.setItemCount(r.size());
                for (GenericMap::Value::const_iterator it = r.begin();
                    it != r.end(); ++it) {
                    e.startItem();
                    e.encodeString(it->first);
                    write(it->second, e);
                }
            }
            e.mapEnd();
        }
        break;
    default:
        throw Exception(boost::format("Unknown schema type %1%") %
            toString(datum.type()));
    }
}